

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O0

UInt32 crnlib::Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  undefined4 uVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  UInt32 *pUVar8;
  undefined4 *in_RSI;
  long *in_RDI;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 offset;
  UInt32 maxLen;
  UInt32 delta3;
  UInt32 delta2;
  UInt32 hash3Value;
  UInt32 hash2Value;
  uint local_38;
  uint local_34;
  uint local_2c;
  UInt32 local_c;
  
  lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
  if (lenLimit_00 < 4) {
    MatchFinder_MovePos((CMatchFinder *)0x24713c);
    local_c = 0;
  }
  else {
    pbVar2 = (byte *)*in_RDI;
    uVar3 = *(uint *)((long)in_RDI + (ulong)*pbVar2 * 4 + 0x84) ^ (uint)pbVar2[1];
    uVar4 = (uVar3 ^ (uint)pbVar2[2] << 8) & 0xffff;
    uVar5 = (uVar3 ^ (uint)pbVar2[2] << 8 ^
            *(int *)((long)in_RDI + (ulong)pbVar2[3] * 4 + 0x84) << 5) & *(uint *)(in_RDI + 7);
    local_2c = (int)in_RDI[1] - *(int *)(in_RDI[5] + (ulong)(uVar3 & 0x3ff) * 4);
    uVar6 = (int)in_RDI[1] - *(int *)(in_RDI[5] + (ulong)(uVar4 + 0x400) * 4);
    curMatch_00 = *(UInt32 *)(in_RDI[5] + (ulong)(uVar5 + 0x10400) * 4);
    uVar1 = (undefined4)in_RDI[1];
    *(undefined4 *)(in_RDI[5] + (ulong)(uVar5 + 0x10400) * 4) = uVar1;
    *(undefined4 *)(in_RDI[5] + (ulong)(uVar4 + 0x400) * 4) = uVar1;
    *(undefined4 *)(in_RDI[5] + (ulong)(uVar3 & 0x3ff) * 4) = uVar1;
    local_34 = 1;
    local_38 = 0;
    if ((local_2c < *(uint *)((long)in_RDI + 0x1c)) && (pbVar2[-(ulong)local_2c] == *pbVar2)) {
      local_34 = 2;
      *in_RSI = 2;
      in_RSI[1] = local_2c - 1;
      local_38 = 2;
    }
    if (((local_2c != uVar6) && (uVar6 < *(uint *)((long)in_RDI + 0x1c))) &&
       (pbVar2[-(ulong)uVar6] == *pbVar2)) {
      local_34 = 3;
      in_RSI[local_38 + 1] = uVar6 - 1;
      local_38 = local_38 + 2;
      local_2c = uVar6;
    }
    if (local_38 != 0) {
      for (; (local_34 != lenLimit_00 &&
             (pbVar2[(ulong)local_34 - (ulong)local_2c] == pbVar2[local_34]));
          local_34 = local_34 + 1) {
      }
      in_RSI[local_38 - 2] = local_34;
      if (local_34 == lenLimit_00) {
        SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                        (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),*(UInt32 *)((long)in_RDI + 0x1c)
                        ,*(UInt32 *)((long)in_RDI + 0x3c));
        *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
        *in_RDI = *in_RDI + 1;
        iVar7 = (int)in_RDI[1] + 1;
        *(int *)(in_RDI + 1) = iVar7;
        if (iVar7 == *(int *)((long)in_RDI + 0xc)) {
          MatchFinder_CheckLimits((CMatchFinder *)0x247447);
        }
        return local_38;
      }
    }
    if (local_34 < 3) {
      local_34 = 3;
    }
    pUVar8 = GetMatchesSpec1(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                             (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),
                             *(UInt32 *)((long)in_RDI + 0x1c),*(UInt32 *)((long)in_RDI + 0x3c),
                             in_RSI + local_38,local_34);
    local_c = (UInt32)((long)pUVar8 - (long)in_RSI >> 2);
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
    *in_RDI = *in_RDI + 1;
    iVar7 = (int)in_RDI[1] + 1;
    *(int *)(in_RDI + 1) = iVar7;
    if (iVar7 == *(int *)((long)in_RDI + 0xc)) {
      MatchFinder_CheckLimits((CMatchFinder *)0x247519);
    }
  }
  return local_c;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  GET_MATCHES_FOOTER(offset, maxLen)
}